

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O3

REF_STATUS ref_interp_nearest_tet_via_tri_in_tree(REF_INTERP ref_interp,REF_SEARCH ref_search)

{
  size_t sVar1;
  double dVar2;
  double dVar3;
  REF_INT RVar4;
  REF_MPI ref_mpi;
  REF_NODE pRVar5;
  REF_CELL pRVar6;
  REF_NODE pRVar7;
  REF_GLOB *pRVar8;
  REF_DBL *pRVar9;
  undefined1 auVar10 [16];
  uint uVar11;
  void *pvVar12;
  double *pdVar13;
  REF_INT *pRVar14;
  ulong uVar15;
  undefined8 uVar16;
  long lVar17;
  REF_INT *pRVar18;
  ulong uVar19;
  double *val;
  long lVar20;
  long lVar21;
  char *pcVar22;
  ulong uVar23;
  REF_INT RVar24;
  int iVar26;
  undefined1 auVar25 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iVar30;
  REF_INT total_node;
  REF_INT *local_180;
  REF_INT *local_178;
  REF_INT *local_170;
  REF_SEARCH local_168;
  REF_INT nrecv;
  double *local_158;
  REF_INT *local_150;
  REF_INT *source;
  REF_DBL *global_xyz;
  REF_LIST ref_list;
  void *local_130;
  void *local_128;
  void *local_120;
  void *local_118;
  uint local_110;
  uint local_10c;
  REF_DBL *recv_bary;
  REF_INT *recv_node;
  REF_INT *recv_cell;
  REF_INT *recv_proc;
  REF_INT *global_node;
  void *local_e0;
  REF_NODE local_d8;
  REF_CELL local_d0;
  REF_DBL bary [4];
  REF_INT nodes [27];
  
  ref_mpi = ref_interp->ref_mpi;
  pRVar5 = ref_interp->from_grid->node;
  pRVar6 = ref_interp->from_tet;
  pRVar7 = ref_interp->to_grid->node;
  uVar11 = ref_list_create(&ref_list);
  if (uVar11 == 0) {
    iVar26 = pRVar7->max;
    uVar23 = (ulong)iVar26;
    local_168 = ref_search;
    local_d8 = pRVar5;
    local_d0 = pRVar6;
    if ((long)uVar23 < 1) {
      uVar11 = 0;
    }
    else {
      uVar15 = 0;
      uVar11 = 0;
      do {
        if ((-1 < pRVar7->global[uVar15]) && (pRVar7->ref_mpi->id == pRVar7->part[uVar15])) {
          uVar11 = uVar11 + (ref_interp->cell[uVar15] == -1);
        }
        uVar15 = uVar15 + 1;
      } while (uVar23 != uVar15);
      if ((int)uVar11 < 0) {
        pcVar22 = "malloc local_node of REF_INT negative";
        uVar16 = 0x567;
        goto LAB_001602b1;
      }
    }
    pvVar12 = malloc((ulong)uVar11 << 2);
    if (pvVar12 == (void *)0x0) {
      pcVar22 = "malloc local_node of REF_INT NULL";
      uVar16 = 0x567;
LAB_001603ca:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             uVar16,"ref_interp_nearest_tet_via_tri_in_tree",pcVar22);
      return 2;
    }
    local_118 = pvVar12;
    pvVar12 = malloc((ulong)(uVar11 * 3) << 3);
    if (pvVar12 == (void *)0x0) {
      pcVar22 = "malloc local_xyz of REF_DBL NULL";
      uVar16 = 0x568;
      goto LAB_001603ca;
    }
    if (iVar26 < 1) {
      RVar24 = 0;
    }
    else {
      pRVar8 = pRVar7->global;
      uVar15 = 0;
      lVar17 = 2;
      RVar24 = 0;
      do {
        if (((-1 < pRVar8[uVar15]) && (pRVar7->ref_mpi->id == pRVar7->part[uVar15])) &&
           (ref_interp->cell[uVar15] == -1)) {
          *(int *)((long)local_118 + (long)RVar24 * 4) = (int)uVar15;
          pRVar9 = pRVar7->real;
          lVar21 = (long)(RVar24 * 3);
          *(REF_DBL *)((long)pvVar12 + lVar21 * 8) = pRVar9[lVar17 + -2];
          *(REF_DBL *)((long)pvVar12 + lVar21 * 8 + 8) = pRVar9[lVar17 + -1];
          *(REF_DBL *)((long)pvVar12 + lVar21 * 8 + 0x10) = pRVar9[lVar17];
          RVar24 = RVar24 + 1;
        }
        uVar15 = uVar15 + 1;
        lVar17 = lVar17 + 0xf;
      } while (uVar15 < uVar23);
    }
    uVar11 = ref_mpi_allconcat(ref_mpi,3,RVar24,pvVar12,&total_node,&source,&global_xyz,3);
    if (uVar11 == 0) {
      local_e0 = pvVar12;
      if (source != (REF_INT *)0x0) {
        free(source);
      }
      uVar11 = ref_mpi_allconcat(ref_mpi,1,RVar24,local_118,&total_node,&source,&global_node,1);
      RVar24 = total_node;
      if (uVar11 == 0) {
        lVar17 = (long)total_node;
        if (lVar17 < 0) {
          pcVar22 = "malloc best_bary of REF_DBL negative";
          uVar16 = 0x57b;
LAB_001602b1:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 uVar16,"ref_interp_nearest_tet_via_tri_in_tree",pcVar22);
          return 1;
        }
        pdVar13 = (double *)malloc(lVar17 * 8);
        if (pdVar13 == (double *)0x0) {
          pcVar22 = "malloc best_bary of REF_DBL NULL";
          uVar16 = 0x57b;
          goto LAB_001603ca;
        }
        sVar1 = lVar17 * 4;
        local_120 = malloc(sVar1);
        if (local_120 == (void *)0x0) {
          pcVar22 = "malloc best_node of REF_INT NULL";
          uVar16 = 0x57c;
          goto LAB_001603ca;
        }
        pRVar14 = (REF_INT *)malloc(sVar1);
        if (pRVar14 == (REF_INT *)0x0) {
          pcVar22 = "malloc best_cell of REF_INT NULL";
          uVar16 = 0x57d;
          goto LAB_001603ca;
        }
        local_150 = pRVar14;
        pRVar14 = (REF_INT *)malloc(sVar1);
        if (pRVar14 == (REF_INT *)0x0) {
          pcVar22 = "malloc from_proc of REF_INT NULL";
          uVar16 = 0x57e;
          goto LAB_001603ca;
        }
        if (RVar24 == 0) {
          val = pdVar13;
          RVar24 = 0;
        }
        else {
          lVar17 = 0;
          lVar21 = 0;
          pRVar18 = local_150;
          local_170 = pRVar14;
          local_158 = pdVar13;
          do {
            *(REF_INT *)((long)local_120 + lVar21 * 4) = global_node[lVar21];
            *pRVar18 = -1;
            *pdVar13 = 1e+20;
            local_180 = pRVar18;
            uVar11 = ref_search_nearest_candidates
                               (local_168,ref_list,(REF_DBL *)((long)global_xyz + lVar17));
            pRVar14 = local_180;
            if (uVar11 != 0) {
              pcVar22 = "near candidates";
              uVar16 = 0x585;
              goto LAB_00160213;
            }
            if (ref_list->n < 1) {
              *local_180 = -1;
            }
            else {
              uVar11 = ref_interp_best_tri_in_list
                                 (ref_interp,ref_list,(REF_DBL *)((long)global_xyz + lVar17),
                                  local_180,bary);
              if (uVar11 != 0) {
                pcVar22 = "best in list";
                uVar16 = 0x58a;
                goto LAB_00160213;
              }
              if (*pRVar14 != -1) {
                dVar2 = bary[0];
                if (bary[1] <= bary[0]) {
                  dVar2 = bary[1];
                }
                dVar3 = bary[2];
                if (bary[3] <= bary[2]) {
                  dVar3 = bary[3];
                }
                if (dVar3 <= dVar2) {
                  dVar2 = dVar3;
                }
                *pdVar13 = -dVar2;
              }
            }
            ref_interp->tree_cells = ref_interp->tree_cells + ref_list->n;
            uVar11 = ref_list_erase(ref_list);
            if (uVar11 != 0) {
              pcVar22 = "reset list";
              uVar16 = 0x593;
              goto LAB_00160213;
            }
            lVar21 = lVar21 + 1;
            lVar17 = lVar17 + 0x18;
            pdVar13 = pdVar13 + 1;
            pRVar18 = local_180 + 1;
            pRVar14 = local_170;
            val = local_158;
            RVar24 = total_node;
          } while (lVar21 < total_node);
        }
        uVar11 = ref_mpi_allminwho(ref_mpi,val,pRVar14,RVar24);
        RVar24 = total_node;
        if (uVar11 == 0) {
          uVar23 = (ulong)total_node;
          if ((long)uVar23 < 1) {
            uVar11 = 0;
          }
          else {
            uVar15 = 0;
            uVar11 = 0;
            do {
              uVar11 = uVar11 + (ref_mpi->id == pRVar14[uVar15]);
              uVar15 = uVar15 + 1;
            } while (uVar23 != uVar15);
          }
          local_170 = pRVar14;
          local_158 = val;
          pvVar12 = malloc((ulong)(uVar11 * 4) << 3);
          if (pvVar12 == (void *)0x0) {
            pcVar22 = "malloc send_bary of REF_DBL NULL";
            uVar16 = 0x59d;
            goto LAB_001603ca;
          }
          uVar15 = (ulong)uVar11;
          sVar1 = uVar15 * 4;
          local_168 = (REF_SEARCH)malloc(sVar1);
          if (local_168 == (REF_SEARCH)0x0) {
            pcVar22 = "malloc send_cell of REF_INT NULL";
            uVar16 = 0x59e;
            goto LAB_001603ca;
          }
          local_128 = pvVar12;
          local_180 = (REF_INT *)malloc(sVar1);
          if (local_180 == (REF_INT *)0x0) {
            pcVar22 = "malloc send_node of REF_INT NULL";
            uVar16 = 0x59f;
            goto LAB_001603ca;
          }
          local_178 = (REF_INT *)malloc(sVar1);
          if (local_178 == (REF_INT *)0x0) {
            pcVar22 = "malloc send_proc of REF_INT NULL";
            uVar16 = 0x5a0;
            goto LAB_001603ca;
          }
          local_130 = malloc(sVar1);
          auVar10 = _DAT_002111c0;
          if (local_130 == (void *)0x0) {
            pcVar22 = "malloc my_proc of REF_INT NULL";
            uVar16 = 0x5a1;
            local_130 = (void *)0x0;
            goto LAB_001603ca;
          }
          if (uVar11 != 0) {
            RVar4 = ref_mpi->id;
            lVar17 = uVar15 - 1;
            auVar25._8_4_ = (int)lVar17;
            auVar25._0_8_ = lVar17;
            auVar25._12_4_ = (int)((ulong)lVar17 >> 0x20);
            uVar19 = 0;
            auVar25 = auVar25 ^ _DAT_002111c0;
            auVar27 = _DAT_002111a0;
            auVar28 = _DAT_002111b0;
            do {
              auVar29 = auVar28 ^ auVar10;
              iVar26 = auVar25._4_4_;
              if ((bool)(~(auVar29._4_4_ == iVar26 && auVar25._0_4_ < auVar29._0_4_ ||
                          iVar26 < auVar29._4_4_) & 1)) {
                *(REF_INT *)((long)local_130 + uVar19) = RVar4;
              }
              if ((auVar29._12_4_ != auVar25._12_4_ || auVar29._8_4_ <= auVar25._8_4_) &&
                  auVar29._12_4_ <= auVar25._12_4_) {
                *(REF_INT *)((long)local_130 + uVar19 + 4) = RVar4;
              }
              auVar29 = auVar27 ^ auVar10;
              iVar30 = auVar29._4_4_;
              if (iVar30 <= iVar26 && (iVar30 != iVar26 || auVar29._0_4_ <= auVar25._0_4_)) {
                *(REF_INT *)((long)local_130 + uVar19 + 8) = RVar4;
                *(REF_INT *)((long)local_130 + uVar19 + 0xc) = RVar4;
              }
              lVar17 = auVar28._8_8_;
              auVar28._0_8_ = auVar28._0_8_ + 4;
              auVar28._8_8_ = lVar17 + 4;
              lVar17 = auVar27._8_8_;
              auVar27._0_8_ = auVar27._0_8_ + 4;
              auVar27._8_8_ = lVar17 + 4;
              uVar19 = uVar19 + 0x10;
            } while ((uVar15 * 4 + 0xc & 0xfffffffffffffff0) != uVar19);
          }
          if (RVar24 < 1) {
            RVar24 = 0;
          }
          else {
            lVar17 = 0;
            lVar21 = 0;
            RVar24 = 0;
            pRVar14 = local_150;
            pRVar18 = local_170;
            do {
              if (ref_mpi->id == pRVar18[lVar21]) {
                local_178[RVar24] = source[lVar21];
                local_10c = *(uint *)((long)local_120 + lVar21 * 4);
                local_180[RVar24] = local_10c;
                uVar11 = pRVar14[lVar21];
                (&local_168->d)[RVar24] = uVar11;
                if (uVar11 != 0xffffffff) {
                  local_110 = uVar11;
                  uVar11 = ref_cell_nodes(local_d0,uVar11,nodes);
                  if (uVar11 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                           ,0x5ad,"ref_interp_nearest_tet_via_tri_in_tree",(ulong)uVar11,
                           "tet should be set and valid via tri search");
                    printf("global %d best cell %d best bary %e\n",local_158[lVar21],
                           (ulong)local_10c,(ulong)local_110);
                    return uVar11;
                  }
                  uVar11 = ref_node_bary4(local_d8,nodes,(REF_DBL *)((long)global_xyz + lVar17),
                                          (REF_DBL *)((long)local_128 + (long)(RVar24 * 4) * 8));
                  if (uVar11 != 0) {
                    uVar23 = (ulong)uVar11;
                    pcVar22 = "bary";
                    uVar16 = 0x5b0;
                    goto LAB_00160d25;
                  }
                  uVar23 = (ulong)(uint)total_node;
                  pRVar14 = local_150;
                  pRVar18 = local_170;
                }
                RVar24 = RVar24 + 1;
              }
              lVar21 = lVar21 + 1;
              lVar17 = lVar17 + 0x18;
            } while (lVar21 < (int)uVar23);
          }
          uVar11 = ref_mpi_blindsend(ref_mpi,local_178,local_180,1,RVar24,&recv_node,&nrecv,1);
          if (uVar11 == 0) {
            uVar11 = ref_mpi_blindsend(ref_mpi,local_178,local_168,1,RVar24,&recv_cell,&nrecv,1);
            if (uVar11 == 0) {
              uVar11 = ref_mpi_blindsend(ref_mpi,local_178,local_130,1,RVar24,&recv_proc,&nrecv,1);
              if (uVar11 == 0) {
                uVar11 = ref_mpi_blindsend(ref_mpi,local_178,local_128,4,RVar24,&recv_bary,&nrecv,3)
                ;
                if (uVar11 == 0) {
                  if (0 < nrecv) {
                    pRVar14 = ref_interp->cell;
                    lVar21 = 0;
                    lVar17 = 0;
                    do {
                      ref_interp->n_tree = ref_interp->n_tree + 1;
                      iVar26 = recv_node[lVar17];
                      if ((long)pRVar14[iVar26] != -1) {
                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                               ,0x5c5,"ref_interp_nearest_tet_via_tri_in_tree","tree already found?"
                               ,0xffffffffffffffff,(long)pRVar14[iVar26]);
                        return 1;
                      }
                      if (ref_interp->agent_hired[iVar26] != 0) {
                        uVar11 = ref_agents_delete(ref_interp->ref_agents,iVar26);
                        if (uVar11 != 0) {
                          uVar23 = (ulong)uVar11;
                          pcVar22 = "deq";
                          uVar16 = 0x5c7;
                          goto LAB_00160d25;
                        }
                        ref_interp->agent_hired[iVar26] = 0;
                        pRVar14 = ref_interp->cell;
                      }
                      pRVar14[iVar26] = recv_cell[lVar17];
                      ref_interp->part[iVar26] = recv_proc[lVar17];
                      if (recv_cell[lVar17] == -1) {
                        ref_interp->n_tree = ref_interp->n_tree + -1;
                      }
                      else {
                        pRVar9 = ref_interp->bary;
                        lVar20 = 0;
                        do {
                          pRVar9[(iVar26 << 2) + lVar20] =
                               *(REF_DBL *)((long)recv_bary + lVar20 * 8 + lVar21);
                          lVar20 = lVar20 + 1;
                        } while (lVar20 != 4);
                      }
                      lVar17 = lVar17 + 1;
                      lVar21 = lVar21 + 0x20;
                    } while (lVar17 < nrecv);
                  }
                  uVar11 = ref_mpi_allsum(ref_mpi,&ref_interp->n_tree,1,1);
                  if (uVar11 == 0) {
                    if (recv_node != (REF_INT *)0x0) {
                      free(recv_node);
                    }
                    if (recv_cell != (REF_INT *)0x0) {
                      free(recv_cell);
                    }
                    if (recv_proc != (REF_INT *)0x0) {
                      free(recv_proc);
                    }
                    if (recv_bary != (REF_DBL *)0x0) {
                      free(recv_bary);
                    }
                    free(local_128);
                    free(local_130);
                    free(local_168);
                    free(local_180);
                    free(local_178);
                    free(local_170);
                    free(local_150);
                    free(local_120);
                    free(local_158);
                    if (source != (REF_INT *)0x0) {
                      free(source);
                    }
                    if (global_node != (REF_INT *)0x0) {
                      free(global_node);
                    }
                    if (global_xyz != (REF_DBL *)0x0) {
                      free(global_xyz);
                    }
                    free(local_e0);
                    free(local_118);
                    uVar11 = ref_list_free(ref_list);
                    if (uVar11 == 0) {
                      if ((long)pRVar7->max < 1) {
                        return 0;
                      }
                      lVar17 = 0;
                      while (((pRVar7->global[lVar17] < 0 ||
                              (pRVar7->ref_mpi->id != pRVar7->part[lVar17])) ||
                             (ref_interp->cell[lVar17] != -1))) {
                        lVar17 = lVar17 + 1;
                        if (pRVar7->max == lVar17) {
                          return 0;
                        }
                      }
                      pcVar22 = "node missed by tree";
                      uVar16 = 0x5f0;
                      goto LAB_001602b1;
                    }
                    uVar23 = (ulong)uVar11;
                    pcVar22 = "free list";
                    uVar16 = 0x5ec;
                  }
                  else {
                    uVar23 = (ulong)uVar11;
                    pcVar22 = "as";
                    uVar16 = 0x5d4;
                  }
                }
                else {
                  uVar23 = (ulong)uVar11;
                  pcVar22 = "blind send bary";
                  uVar16 = 0x5c0;
                }
              }
              else {
                uVar23 = (ulong)uVar11;
                pcVar22 = "blind send proc";
                uVar16 = 0x5bd;
              }
            }
            else {
              uVar23 = (ulong)uVar11;
              pcVar22 = "blind send cell";
              uVar16 = 0x5ba;
            }
          }
          else {
            uVar23 = (ulong)uVar11;
            pcVar22 = "blind send node";
            uVar16 = 0x5b7;
          }
LAB_00160d25:
          uVar11 = (uint)uVar23;
          goto LAB_00160218;
        }
        pcVar22 = "who";
        uVar16 = 0x597;
      }
      else {
        pcVar22 = "cat";
        uVar16 = 0x579;
      }
    }
    else {
      pcVar22 = "cat";
      uVar16 = 0x575;
    }
  }
  else {
    pcVar22 = "create list";
    uVar16 = 0x55f;
  }
LAB_00160213:
  uVar23 = (ulong)uVar11;
LAB_00160218:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar16,
         "ref_interp_nearest_tet_via_tri_in_tree",uVar23,pcVar22);
  return uVar11;
}

Assistant:

REF_FCN static REF_STATUS ref_interp_nearest_tet_via_tri_in_tree(
    REF_INTERP ref_interp, REF_SEARCH ref_search) {
  REF_GRID from_grid = ref_interp_from_grid(ref_interp);
  REF_GRID to_grid = ref_interp_to_grid(ref_interp);
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_NODE from_node = ref_grid_node(from_grid);
  REF_CELL from_tet = ref_interp_from_tet(ref_interp);
  REF_NODE to_node = ref_grid_node(to_grid);
  REF_DBL bary[4];
  REF_LIST ref_list;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node, *best_node, *best_cell, *from_proc;
  REF_DBL *best_bary;
  REF_INT ntarget;
  REF_DBL *local_xyz, *global_xyz;
  REF_INT *local_node, *global_node;
  REF_INT *source, total_node;
  REF_INT nsend, nrecv;
  REF_INT *send_proc, *my_proc, *recv_proc;
  REF_INT *send_cell, *recv_cell;
  REF_INT *send_node, *recv_node;
  REF_DBL *send_bary, *recv_bary;
  REF_INT i, item;

  RSS(ref_list_create(&ref_list), "create list");

  ntarget = 0;
  each_ref_node_valid_node(to_node, node) {
    if (!ref_node_owned(to_node, node) || REF_EMPTY != ref_interp->cell[node])
      continue;
    ntarget++;
  }
  ref_malloc(local_node, ntarget, REF_INT);
  ref_malloc(local_xyz, 3 * ntarget, REF_DBL);
  ntarget = 0;
  each_ref_node_valid_node(to_node, node) {
    if (!ref_node_owned(to_node, node) || REF_EMPTY != ref_interp->cell[node])
      continue;
    local_node[ntarget] = node;
    local_xyz[0 + 3 * ntarget] = ref_node_xyz(to_node, 0, node);
    local_xyz[1 + 3 * ntarget] = ref_node_xyz(to_node, 1, node);
    local_xyz[2 + 3 * ntarget] = ref_node_xyz(to_node, 2, node);
    ntarget++;
  }
  RSS(ref_mpi_allconcat(ref_mpi, 3, ntarget, (void *)local_xyz, &total_node,
                        &source, (void **)&global_xyz, REF_DBL_TYPE),
      "cat");
  ref_free(source);
  RSS(ref_mpi_allconcat(ref_mpi, 1, ntarget, (void *)local_node, &total_node,
                        &source, (void **)&global_node, REF_INT_TYPE),
      "cat");

  ref_malloc(best_bary, total_node, REF_DBL);
  ref_malloc(best_node, total_node, REF_INT);
  ref_malloc(best_cell, total_node, REF_INT);
  ref_malloc(from_proc, total_node, REF_INT);
  for (node = 0; node < total_node; node++) {
    best_node[node] = global_node[node];
    best_cell[node] = REF_EMPTY;
    best_bary[node] = 1.0e20; /* negative for min, until use allmaxwho */
    RSS(ref_search_nearest_candidates(ref_search, ref_list,
                                      &(global_xyz[3 * node])),
        "near candidates");
    if (ref_list_n(ref_list) > 0) {
      RSS(ref_interp_best_tri_in_list(ref_interp, ref_list,
                                      &(global_xyz[3 * node]),
                                      &(best_cell[node]), bary),
          "best in list");
      if (REF_EMPTY != best_cell[node]) {
        /* negative for min, until use allmaxwho */
        best_bary[node] = -MIN(MIN(bary[0], bary[1]), MIN(bary[2], bary[3]));
      }
    } else {
      best_cell[node] = REF_EMPTY;
    }
    (ref_interp->tree_cells) += ref_list_n(ref_list);
    RSS(ref_list_erase(ref_list), "reset list");
  }

  /* negative for min, until use max*/
  RSS(ref_mpi_allminwho(ref_mpi, best_bary, from_proc, total_node), "who");

  nsend = 0;
  for (node = 0; node < total_node; node++)
    if (ref_mpi_rank(ref_mpi) == from_proc[node]) nsend++;

  ref_malloc(send_bary, 4 * nsend, REF_DBL);
  ref_malloc(send_cell, nsend, REF_INT);
  ref_malloc(send_node, nsend, REF_INT);
  ref_malloc(send_proc, nsend, REF_INT);
  ref_malloc_init(my_proc, nsend, REF_INT, ref_mpi_rank(ref_mpi));
  nsend = 0;
  for (node = 0; node < total_node; node++)
    if (ref_mpi_rank(ref_mpi) == from_proc[node]) {
      send_proc[nsend] = source[node];
      send_node[nsend] = best_node[node];
      send_cell[nsend] = best_cell[node];
      if (REF_EMPTY != send_cell[nsend]) {
        RSB(ref_cell_nodes(from_tet, best_cell[node], nodes),
            "tet should be set and valid via tri search", {
              printf("global %d best cell %d best bary %e\n", best_node[node],
                     best_cell[node], best_bary[node]);
            });
        RSS(ref_node_bary4(from_node, nodes, &(global_xyz[3 * node]),
                           &(send_bary[4 * nsend])),
            "bary");
      }
      nsend++;
    }

  RSS(ref_mpi_blindsend(ref_mpi, send_proc, (void *)send_node, 1, nsend,
                        (void **)(&recv_node), &nrecv, REF_INT_TYPE),
      "blind send node");
  RSS(ref_mpi_blindsend(ref_mpi, send_proc, (void *)send_cell, 1, nsend,
                        (void **)(&recv_cell), &nrecv, REF_INT_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, send_proc, (void *)my_proc, 1, nsend,
                        (void **)(&recv_proc), &nrecv, REF_INT_TYPE),
      "blind send proc");
  RSS(ref_mpi_blindsend(ref_mpi, send_proc, (void *)send_bary, 4, nsend,
                        (void **)(&recv_bary), &nrecv, REF_DBL_TYPE),
      "blind send bary");

  for (item = 0; item < nrecv; item++) {
    (ref_interp->n_tree)++;
    node = recv_node[item];
    REIS(REF_EMPTY, ref_interp->cell[node], "tree already found?");
    if (ref_interp->agent_hired[node]) { /* need to dequeue */
      RSS(ref_agents_delete(ref_interp->ref_agents, node), "deq");
      ref_interp->agent_hired[node] = REF_FALSE;
    }
    ref_interp->cell[node] = recv_cell[item];
    ref_interp->part[node] = recv_proc[item];
    if (REF_EMPTY != recv_cell[item]) {
      for (i = 0; i < 4; i++)
        ref_interp->bary[i + 4 * node] = recv_bary[i + 4 * item];
    } else {
      (ref_interp->n_tree)--;
    }
  }

  RSS(ref_mpi_allsum(ref_mpi, &(ref_interp->n_tree), 1, REF_INT_TYPE), "as");

  ref_free(recv_node);
  ref_free(recv_cell);
  ref_free(recv_proc);
  ref_free(recv_bary);

  ref_free(send_bary);
  ref_free(my_proc);
  ref_free(send_cell);
  ref_free(send_node);
  ref_free(send_proc);

  ref_free(from_proc);
  ref_free(best_cell);
  ref_free(best_node);
  ref_free(best_bary);

  ref_free(source);
  ref_free(global_node);
  ref_free(global_xyz);
  ref_free(local_xyz);
  ref_free(local_node);

  RSS(ref_list_free(ref_list), "free list");

  each_ref_node_valid_node(to_node, node) {
    if (ref_node_owned(to_node, node)) {
      RUS(REF_EMPTY, ref_interp->cell[node], "node missed by tree");
    }
  }

  return REF_SUCCESS;
}